

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_mul(mp_int *a,mp_int *b,mp_int *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int digs;
  
  iVar5 = a->used;
  iVar1 = a->sign;
  iVar2 = b->used;
  iVar3 = b->sign;
  digs = iVar2 + iVar5 + 1;
  iVar4 = iVar2;
  if (iVar5 < iVar2) {
    iVar4 = iVar5;
  }
  if ((iVar2 + iVar5 < 0x1ff) && (iVar4 < 0x101)) {
    iVar5 = fast_s_mp_mul_digs(a,b,c,digs);
  }
  else {
    iVar5 = s_mp_mul_digs(a,b,c,digs);
  }
  c->sign = (uint)(0 < c->used && iVar1 != iVar3);
  return iVar5;
}

Assistant:

int mp_mul (mp_int * a, mp_int * b, mp_int * c)
{
  int     res, neg;
  neg = (a->sign == b->sign) ? MP_ZPOS : MP_NEG;

  {
    /* can we use the fast multiplier?
     *
     * The fast multiplier can be used if the output will 
     * have less than MP_WARRAY digits and the number of 
     * digits won't affect carry propagation
     */
    int     digs = a->used + b->used + 1;

    if ((digs < MP_WARRAY) &&
        MIN(a->used, b->used) <= 
        (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
      res = fast_s_mp_mul_digs (a, b, c, digs);
    } else 
      res = s_mp_mul (a, b, c); /* uses s_mp_mul_digs */
  }
  c->sign = (c->used > 0) ? neg : MP_ZPOS;
  return res;
}